

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

unqlite_col * unqliteVmFetchCollection(unqlite_vm *pVm,SyString *pName)

{
  sxu32 nLen;
  sxu32 nSize;
  char *pSrc;
  sxu32 sVar1;
  int iVar2;
  unqlite_col *puVar3;
  
  if (pVm->iCol != 0) {
    pSrc = pName->zString;
    nLen = pName->nByte;
    sVar1 = SyBinHash(pSrc,nLen);
    for (puVar3 = pVm->apCol[pVm->iColSize - 1 & sVar1]; puVar3 != (unqlite_col *)0x0;
        puVar3 = puVar3->pNextCol) {
      if (sVar1 == puVar3->nHash) {
        nSize = (puVar3->sName).nByte;
        iVar2 = nLen - nSize;
        if (iVar2 == 0) {
          iVar2 = SyMemcmp(pSrc,(puVar3->sName).zString,nSize);
        }
        if (iVar2 == 0) {
          return puVar3;
        }
      }
    }
  }
  return (unqlite_col *)0x0;
}

Assistant:

static unqlite_col * unqliteVmFetchCollection(
	unqlite_vm *pVm, /* Target VM */
	SyString *pName  /* Lookup name */
	)
{
	unqlite_col *pCol;
	sxu32 nHash;
	if( pVm->iCol < 1 ){
		/* Don't bother hashing */
		return 0;
	}
	nHash = SyBinHash((const void *)pName->zString,pName->nByte);
	/* Perform the lookup */
	pCol = pVm->apCol[nHash & ( pVm->iColSize - 1)];
	for(;;){
		if( pCol == 0 ){
			break;
		}
		if( nHash == pCol->nHash && SyStringCmp(pName,&pCol->sName,SyMemcmp) == 0 ){
			/* Collection found */
			return pCol;
		}
		/* Point to the next entry */
		pCol = pCol->pNextCol;
	}
	/* No such collection */
	return 0;
}